

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O2

int __thiscall
JetHead::CircularBuffer::write_internal(CircularBuffer *this,uint8_t *buffer,int size)

{
  int iVar1;
  uint8_t *puVar2;
  uint8_t *puVar3;
  uint uVar4;
  uint uVar5;
  
  uVar5 = 0;
  if (buffer != (uint8_t *)0x0) {
    iVar1 = getFreeSpace(this);
    if (iVar1 < size) {
      size = getFreeSpace(this);
    }
    if (size != 0) {
      puVar3 = this->mWritePtr;
      puVar2 = this->mEnd;
      uVar4 = (int)puVar2 - (int)puVar3;
      uVar5 = uVar4;
      if (size < (int)uVar4) {
        uVar5 = size;
      }
      if (((puVar3 != buffer) && (puVar3 != (uint8_t *)0x0)) && (0 < (int)uVar5)) {
        memcpy(puVar3,buffer,(ulong)uVar5);
        puVar3 = this->mWritePtr;
        puVar2 = this->mEnd;
      }
      puVar3 = puVar3 + (int)uVar5;
      this->mWritePtr = puVar3;
      if (puVar3 == puVar2) {
        puVar3 = this->mBuffer;
        this->mWritePtr = puVar3;
      }
      if ((int)uVar4 < size) {
        uVar4 = size - uVar5;
        if (((buffer + (int)uVar5 != puVar3) && (0 < (int)uVar4)) && (puVar3 != (uint8_t *)0x0)) {
          memcpy(puVar3,buffer + (int)uVar5,(ulong)uVar4);
          puVar3 = this->mWritePtr;
        }
        this->mWritePtr = puVar3 + (int)uVar4;
      }
      add_length_internal(this,size);
      Condition::Broadcast(&this->mDataCondition);
      uVar5 = size;
    }
  }
  return uVar5;
}

Assistant:

int CircularBuffer::write_internal( const uint8_t *buffer, int size )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	if ( buffer == NULL )
		return 0;
	
	// limit size to free space, we will return this for the size of
	// this write
	if ( size > getFreeSpace() )
		size = getFreeSpace();

	// if size is zero, return early
	if ( size == 0 )
		return 0;
	
	// first, copy from the write pointer up to the end of the buffer,
	// note that this truncates implicitly to no more than free space
	int tail_size = mEnd - mWritePtr;

	// truncate tail_size to the requested write size, note that size
	// has already been truncated to no more than free space
	if ( tail_size > size )
		tail_size = size;

	bufferCopy( mWritePtr, buffer, tail_size );
	mWritePtr += tail_size;

	// if the write pointer is now at the end of the buffer, then
	// reset it to the beginning of the buffer
	if ( mWritePtr == mEnd )
		mWritePtr = mBuffer;

	// if tail_size is less than size, then we haven't filled free
	// space up to the write request size, so continue at the begining
	// of the buffer
	if ( tail_size < size )
	{
		// compute the remainder of the size bytes to write, which we
		// have already truncated to available free space
		int head_size = size - tail_size;
		
		// copy head_size bytes into the begining of the circular
		// buffer from offset tail_size within our input buffer
		if (buffer != NULL)
		{
			bufferCopy( mWritePtr, buffer + tail_size, head_size );
		}
		mWritePtr += head_size;
	}
	
	// update the space now in use in the buffer
	add_length_internal( size );
	
	// signal all waiters for data.
	mDataCondition.Broadcast();

	LOG( "wp %p rd %p", mWritePtr, mReadPtr );

	return size;
}